

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O1

void Dtt_PrintMulti1(Dtt_Man_t *p)

{
  uint uVar1;
  int iVar2;
  int *__ptr;
  Vec_Int_t *p_00;
  int *piVar3;
  Vec_Int_t *p_01;
  uint uVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  int Entry;
  
  uVar4 = 0;
  do {
    p_00 = (Vec_Int_t *)malloc(0x10);
    p_00->nCap = 100;
    p_00->nSize = 0;
    piVar3 = (int *)malloc(400);
    p_00->pArray = piVar3;
    p_01 = (Vec_Int_t *)malloc(0x10);
    p_01->nCap = 100;
    p_01->nSize = 0;
    piVar3 = (int *)malloc(400);
    p_01->pArray = piVar3;
    if (0 < p->nClasses) {
      lVar6 = 0;
      do {
        if (p->pNodes[lVar6] == uVar4) {
          Vec_IntPush(p_00,p->pTimes[lVar6]);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < p->nClasses);
    }
    uVar1 = p_00->nSize;
    __ptr = p_00->pArray;
    if ((long)(int)uVar1 == 0) {
      if (__ptr != (int *)0x0) {
        free(__ptr);
        p_00->pArray = (int *)0x0;
      }
      free(p_00);
    }
    else {
      qsort(__ptr,(long)(int)uVar1,4,Vec_IntSortCompare1);
      if ((int)uVar1 < 1) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar5 = *__ptr;
      Entry = 1;
      if (uVar1 != 1) {
        uVar7 = 1;
        do {
          iVar2 = __ptr[uVar7];
          if (iVar5 == iVar2) {
            Entry = Entry + 1;
          }
          else {
            if (iVar2 <= iVar5) {
              __assert_fail("Prev < Entry",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNpn2.c"
                            ,0x27f,"void Dtt_PrintMulti1(Dtt_Man_t *)");
            }
            Vec_IntPush(p_01,iVar5);
            Vec_IntPush(p_01,Entry);
            Entry = 1;
            iVar5 = iVar2;
          }
          uVar7 = uVar7 + 1;
        } while (uVar1 != uVar7);
      }
      if (0 < Entry) {
        Vec_IntPush(p_01,iVar5);
        Vec_IntPush(p_01,Entry);
      }
      printf("n=%d : ",(ulong)uVar4);
      iVar5 = p_01->nSize;
      if (1 < iVar5) {
        piVar3 = p_01->pArray;
        lVar6 = 1;
        do {
          printf("%d=%d ",(ulong)(uint)piVar3[lVar6 + -1],(ulong)(uint)piVar3[lVar6]);
          lVar6 = lVar6 + 2;
        } while ((int)lVar6 < iVar5);
      }
      putchar(10);
      free(__ptr);
      p_00->pArray = (int *)0x0;
      free(p_00);
      piVar3 = p_01->pArray;
    }
    if (piVar3 != (int *)0x0) {
      free(piVar3);
      p_01->pArray = (int *)0x0;
    }
    free(p_01);
  } while ((uVar1 != 0) && (uVar4 = uVar4 + 1, uVar4 != 0x10));
  return;
}

Assistant:

void Dtt_PrintMulti1( Dtt_Man_t * p )
{
    int i, n, Entry, Count, Prev;
    for ( n = 0; n < 16; n++ )
    {
        Vec_Int_t * vTimes = Vec_IntAlloc( 100 );
        Vec_Int_t * vUsed  = Vec_IntAlloc( 100 );
        for ( i = 0; i < p->nClasses; i++ )
            if ( p->pNodes[i] == n )
                Vec_IntPush( vTimes, p->pTimes[i] );
        if ( Vec_IntSize(vTimes) == 0 )
        {
            Vec_IntFree(vTimes);
            Vec_IntFree(vUsed);
            break;
        }
        Vec_IntSort( vTimes, 0 );
        Count = 1;
        Prev = Vec_IntEntry( vTimes, 0 );
        Vec_IntForEachEntryStart( vTimes, Entry, i, 1 )
            if ( Prev == Entry )
                Count++;
            else
            {
                assert( Prev < Entry );
                Vec_IntPushTwo( vUsed, Prev, Count );
                Count = 1;
                Prev = Entry;
            }
        if ( Count > 0 )
            Vec_IntPushTwo( vUsed, Prev, Count );
        printf( "n=%d : ", n);
        Vec_IntForEachEntryDouble( vUsed, Prev, Entry, i )
            printf( "%d=%d ", Prev, Entry );
        printf( "\n" );
        Vec_IntFree( vTimes );
        Vec_IntFree( vUsed );
    }
}